

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O3

Expression *
slang::ast::matchElementValue
          (ASTContext *context,Type *elementType,FieldSymbol *targetField,SourceRange sourceRange,
          span<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
          typeSetters,Expression *defaultSetter)

{
  Compilation *pCVar1;
  undefined1 auVar2 [16];
  SourceRange sourceRange_00;
  FieldSymbol *pFVar3;
  bool bVar4;
  int iVar5;
  specific_symbol_iterator<slang::ast::FieldSymbol> targetField_00;
  Type *this;
  undefined4 extraout_var;
  SimpleAssignmentPatternExpression *pSVar6;
  Type *pTVar7;
  ConstantRange CVar8;
  long lVar9;
  undefined4 extraout_var_00;
  Expression *pEVar10;
  Diagnostic *this_00;
  specific_symbol_iterator<slang::ast::FieldSymbol> sVar11;
  FieldSymbol *extraout_RDX;
  specific_symbol_iterator<slang::ast::FieldSymbol> src;
  EVP_PKEY_CTX *src_00;
  SourceLocation SVar12;
  FieldSymbol *field;
  long lVar13;
  SourceRange sourceRange_01;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_(std::ranges::subrange_kind)0>
  sVar14;
  SourceRange sourceRange_02;
  SourceRange sourceRange_03;
  Expression *elemExpr_1;
  Expression *elemExpr;
  SmallVector<const_slang::ast::Expression_*,_5UL> elements;
  bool local_b9;
  ASTContext *local_b8;
  SourceLocation local_b0;
  Expression *local_a8;
  SourceRange local_a0;
  FieldSymbol *local_90;
  Expression *local_88;
  span<const_slang::ast::Expression_*,_18446744073709551615UL> local_80;
  SmallVectorBase<const_slang::ast::Expression_*> local_70 [2];
  
  SVar12 = sourceRange.endLoc;
  sourceRange_01.startLoc = sourceRange.startLoc;
  pTVar7 = elementType->canonical;
  local_b8 = context;
  local_a0.startLoc = sourceRange_01.startLoc;
  local_a0.endLoc = SVar12;
  if (pTVar7 == (Type *)0x0) {
    Type::resolveCanonical(elementType);
    pTVar7 = elementType->canonical;
  }
  if ((pTVar7->super_Symbol).kind == ErrorType) {
LAB_0049397e:
    pSVar6 = (SimpleAssignmentPatternExpression *)0x0;
  }
  else {
    local_b0 = SVar12;
    local_90 = targetField;
    if (typeSetters._M_extent._M_extent_value != 0) {
      lVar13 = 0;
      pEVar10 = (Expression *)0x0;
      local_88 = defaultSetter;
      do {
        pTVar7 = *(Type **)((long)&((typeSetters._M_ptr)->type).ptr + lVar13);
        if ((pTVar7 != (Type *)0x0) && (bVar4 = Type::isMatching(elementType,pTVar7), bVar4)) {
          pEVar10 = *(Expression **)((long)&((typeSetters._M_ptr)->expr).ptr + lVar13);
        }
        lVar13 = lVar13 + 0x10;
      } while (typeSetters._M_extent._M_extent_value << 4 != lVar13);
      defaultSetter = local_88;
      if (pEVar10 != (Expression *)0x0) {
        return pEVar10;
      }
    }
    if (defaultSetter == (Expression *)0x0) {
      pTVar7 = (Type *)0x0;
    }
    else {
      pTVar7 = (Type *)defaultSetter->syntax;
      bVar4 = Type::isMatching(elementType,(defaultSetter->type).ptr);
      if (bVar4) {
        return defaultSetter;
      }
      bVar4 = Type::isSimpleBitVector(elementType);
      if ((bVar4) &&
         (bVar4 = Type::isAssignmentCompatible(elementType,(defaultSetter->type).ptr), bVar4))
      goto LAB_00493c86;
    }
    bVar4 = Type::isStruct(elementType);
    if (bVar4) {
      pTVar7 = elementType->canonical;
      if (pTVar7 == (Type *)0x0) {
        Type::resolveCanonical(elementType);
        pTVar7 = elementType->canonical;
      }
      local_70[0].data_ = (pointer)local_70[0].firstElement;
      local_70[0].len = 0;
      local_70[0].cap = 5;
      sVar14 = Scope::membersOfType<slang::ast::FieldSymbol>
                         ((Scope *)(&pTVar7[1].super_Symbol.kind +
                                   (ulong)((pTVar7->super_Symbol).kind != UnpackedStructType) * 2));
      sVar11 = sVar14._M_end.current;
      targetField_00 = sVar14._M_begin.current;
      src.current = sVar11.current;
      if (targetField_00.current != sVar11.current) {
        pSVar6 = (SimpleAssignmentPatternExpression *)0x0;
        do {
          this = DeclaredType::getType
                           (&(((FieldSymbol *)targetField_00.current)->super_VariableSymbol).
                             super_ValueSymbol.declaredType);
          pTVar7 = this->canonical;
          if (pTVar7 == (Type *)0x0) {
            Type::resolveCanonical(this);
            pTVar7 = this->canonical;
          }
          if (((pTVar7->super_Symbol).kind == ErrorType) ||
             ((((FieldSymbol *)targetField_00.current)->super_VariableSymbol).super_ValueSymbol.
              super_Symbol.name._M_len == 0)) goto LAB_00493cfb;
          sourceRange_00.endLoc = local_a0.endLoc;
          sourceRange_00.startLoc = local_a0.startLoc;
          local_80._M_ptr =
               (pointer)matchElementValue(local_b8,this,(FieldSymbol *)targetField_00.current,
                                          sourceRange_00,typeSetters,defaultSetter);
          if ((Expression *)local_80._M_ptr == (Expression *)0x0) {
            pSVar6 = (SimpleAssignmentPatternExpression *)0x0;
            goto LAB_00493cfb;
          }
          SmallVectorBase<slang::ast::Expression_const*>::
          emplace_back<slang::ast::Expression_const*const&>
                    ((SmallVectorBase<slang::ast::Expression_const*> *)local_70,
                     (Expression **)&local_80);
          do {
            targetField_00.current =
                 (((FieldSymbol *)targetField_00.current)->super_VariableSymbol).super_ValueSymbol.
                 super_Symbol.nextInScope;
            if ((FieldSymbol *)targetField_00.current == (FieldSymbol *)0x0) {
              targetField_00.current = (Symbol *)0x0;
              break;
            }
          } while ((((FieldSymbol *)targetField_00.current)->super_VariableSymbol).super_ValueSymbol
                   .super_Symbol.kind != Field);
          src.current = (Symbol *)extraout_RDX;
        } while (targetField_00.current != sVar11.current);
      }
      pCVar1 = ((local_b8->scope).ptr)->compilation;
      local_a8 = (Expression *)((ulong)local_a8 & 0xffffffffffffff00);
      iVar5 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                        (local_70,(EVP_PKEY_CTX *)pCVar1,(EVP_PKEY_CTX *)src.current);
      local_80._M_ptr = (pointer)CONCAT44(extraout_var,iVar5);
      pSVar6 = BumpAllocator::
               emplace<slang::ast::SimpleAssignmentPatternExpression,slang::ast::Type_const&,bool,std::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::SourceRange&>
                         (&pCVar1->super_BumpAllocator,elementType,(bool *)&local_a8,&local_80,
                          &local_a0);
LAB_00493cfb:
      if (local_70[0].data_ == (pointer)local_70[0].firstElement) {
        return (Expression *)pSVar6;
      }
    }
    else {
      bVar4 = Type::isArray(elementType);
      if ((!bVar4) || (bVar4 = Type::hasFixedRange(elementType), !bVar4)) {
        pFVar3 = local_90;
        if (defaultSetter != (Expression *)0x0) {
LAB_00493c86:
          auVar2._8_8_ = 0;
          auVar2._0_8_ = local_b8;
          pEVar10 = Expression::bindRValue
                              ((Expression *)elementType,pTVar7,(ExpressionSyntax *)0x0,
                               (SourceRange)(auVar2 << 0x40),(ASTContext *)0x0,
                               (bitmask<slang::ast::ASTFlags>)typeSetters._M_ptr);
          return pEVar10;
        }
        if (local_90 == (FieldSymbol *)0x0) {
          sourceRange_03.endLoc = local_b0;
          sourceRange_03.startLoc = sourceRange_01.startLoc;
          ASTContext::addDiag(local_b8,(DiagCode)0x140007,sourceRange_03);
        }
        else {
          sourceRange_02.endLoc = local_b0;
          sourceRange_02.startLoc = sourceRange_01.startLoc;
          this_00 = ASTContext::addDiag(local_b8,(DiagCode)0x160007,sourceRange_02);
          Diagnostic::operator<<
                    (this_00,(pFVar3->super_VariableSymbol).super_ValueSymbol.super_Symbol.name);
          Diagnostic::addNote(this_00,(DiagCode)0x50001,
                              (pFVar3->super_VariableSymbol).super_ValueSymbol.super_Symbol.location
                             );
        }
        goto LAB_0049397e;
      }
      pTVar7 = Type::getArrayElementType(elementType);
      sourceRange_01.endLoc = local_b0;
      local_a8 = matchElementValue(local_b8,pTVar7,(FieldSymbol *)0x0,sourceRange_01,typeSetters,
                                   defaultSetter);
      if (local_a8 == (Expression *)0x0) {
        return (Expression *)0x0;
      }
      local_70[0].len = 0;
      local_70[0].cap = 5;
      local_70[0].data_ = (pointer)local_70[0].firstElement;
      CVar8 = Type::getFixedRange(elementType);
      lVar9 = (long)CVar8.left - ((long)CVar8 >> 0x20);
      lVar13 = -lVar9;
      if (0 < lVar9) {
        lVar13 = lVar9;
      }
      iVar5 = (int)lVar13 + 1;
      do {
        SmallVectorBase<slang::ast::Expression_const*>::
        emplace_back<slang::ast::Expression_const*const&>
                  ((SmallVectorBase<slang::ast::Expression_const*> *)local_70,&local_a8);
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
      pCVar1 = ((local_b8->scope).ptr)->compilation;
      local_b9 = false;
      iVar5 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                        (local_70,(EVP_PKEY_CTX *)pCVar1,src_00);
      local_80._M_ptr = (pointer)CONCAT44(extraout_var_00,iVar5);
      pSVar6 = BumpAllocator::
               emplace<slang::ast::SimpleAssignmentPatternExpression,slang::ast::Type_const&,bool,std::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::SourceRange&>
                         (&pCVar1->super_BumpAllocator,elementType,&local_b9,&local_80,&local_a0);
      if (local_70[0].data_ == (pointer)local_70[0].firstElement) {
        return (Expression *)pSVar6;
      }
    }
    operator_delete(local_70[0].data_);
  }
  return (Expression *)pSVar6;
}

Assistant:

static const Expression* matchElementValue(
    const ASTContext& context, const Type& elementType, const FieldSymbol* targetField,
    SourceRange sourceRange,
    std::span<const StructuredAssignmentPatternExpression::TypeSetter> typeSetters,
    const Expression* defaultSetter) {

    // Every element in the array or structure must be covered by one of:
    // index:value      -- recorded in the indexMap (handled only at the top level, not here)
    // member:value     -- recorded in the memberMap (handled only at the top level, not here)
    // type:value       -- recorded in typeSetters, last one takes precedence
    // default:value    -- recorded in defaultSetter, types must be assignable
    // struct element   -- recursively descend into the struct
    // array element    -- recursively descend into the array

    if (elementType.isError())
        return nullptr;

    // Try all type setters for a match. Last one that matches wins.
    const Expression* found = nullptr;
    for (auto& setter : typeSetters) {
        if (setter.type && elementType.isMatching(*setter.type))
            found = setter.expr;
    }
    if (found)
        return found;

    // Otherwise, see if we have a default value that can be applied.
    // The default applies if:
    // - The element type matches exactly
    // - The element type is a simple bit vector and the type is assignment compatible
    const ExpressionSyntax* defaultSyntax = nullptr;
    if (defaultSetter) {
        defaultSyntax = defaultSetter->syntax;
        SLANG_ASSERT(defaultSyntax);
    }

    if (defaultSetter) {
        if (elementType.isMatching(*defaultSetter->type))
            return defaultSetter;

        if (elementType.isSimpleBitVector() &&
            elementType.isAssignmentCompatible(*defaultSetter->type)) {
            return &Expression::bindRValue(elementType, *defaultSyntax, {}, context);
        }
    }

    // Otherwise, we check first if the type is a struct or array, in which
    // case we descend recursively into its members before continuing on with the default.
    if (elementType.isStruct()) {
        const Scope* structScope;
        if (elementType.isUnpackedStruct())
            structScope = &elementType.getCanonicalType().as<UnpackedStructType>();
        else
            structScope = &elementType.getCanonicalType().as<PackedStructType>();

        SmallVector<const Expression*> elements;
        for (auto& field : structScope->membersOfType<FieldSymbol>()) {
            const Type& type = field.getType();
            if (type.isError() || field.name.empty())
                return nullptr;

            auto elemExpr = matchElementValue(context, type, &field, sourceRange, typeSetters,
                                              defaultSetter);
            if (!elemExpr)
                return nullptr;

            elements.push_back(elemExpr);
        }

        auto& comp = context.getCompilation();
        return comp.emplace<SimpleAssignmentPatternExpression>(elementType, /* isLValue */ false,
                                                               elements.copy(comp), sourceRange);
    }

    if (elementType.isArray() && elementType.hasFixedRange()) {
        auto nestedElemType = elementType.getArrayElementType();
        SLANG_ASSERT(nestedElemType);

        auto elemExpr = matchElementValue(context, *nestedElemType, nullptr, sourceRange,
                                          typeSetters, defaultSetter);
        if (!elemExpr)
            return nullptr;

        SmallVector<const Expression*> elements;
        auto arrayRange = elementType.getFixedRange();
        for (int32_t i = arrayRange.lower(); i <= arrayRange.upper(); i++)
            elements.push_back(elemExpr);

        auto& comp = context.getCompilation();
        return comp.emplace<SimpleAssignmentPatternExpression>(elementType, /* isLValue */ false,
                                                               elements.copy(comp), sourceRange);
    }

    // Finally, if we have a default then it must now be assignment compatible.
    if (defaultSetter)
        return &Expression::bindRValue(elementType, *defaultSyntax, {}, context);

    // Otherwise there's no setter for this element, which is an error.
    if (targetField) {
        auto& diag = context.addDiag(diag::AssignmentPatternNoMember, sourceRange);
        diag << targetField->name;
        diag.addNote(diag::NoteDeclarationHere, targetField->location);
    }
    else {
        context.addDiag(diag::AssignmentPatternMissingElements, sourceRange);
    }

    return nullptr;
}